

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<const_slang::ast::Expression_*>::reallocateTo
          (SmallVectorBase<const_slang::ast::Expression_*> *this,size_type newCapacity)

{
  Expression **__result;
  iterator __first;
  EVP_PKEY_CTX *ctx;
  pointer newData;
  size_type newCapacity_local;
  SmallVectorBase<const_slang::ast::Expression_*> *this_local;
  
  __result = (Expression **)slang::detail::allocArray(newCapacity,8);
  __first = begin(this);
  ctx = (EVP_PKEY_CTX *)end(this);
  std::uninitialized_move<slang::ast::Expression_const**,slang::ast::Expression_const**>
            (__first,(Expression **)ctx,__result);
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = __result;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }